

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool Assimp::PLY::ElementInstanceList::ParseInstanceListBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Element *pcElement,ElementInstanceList *p_pcOut,
               PLYImporter *loader,bool p_bBE)

{
  long lVar1;
  ulong uVar2;
  ElementInstance elt;
  ElementInstance local_48;
  
  if (pcElement != (Element *)0x0) {
    if (pcElement->NumOccur != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        if (p_pcOut == (ElementInstanceList *)0x0) {
          local_48.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.alProperties.
          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ElementInstance::ParseInstanceBinary
                    (streamBuffer,buffer,pCur,bufferSize,pcElement,&local_48,p_bBE);
          if (pcElement->eSemantic - EEST_Face < 2) {
            PLYImporter::LoadFace(loader,pcElement,&local_48,(uint)uVar2);
          }
          else if (pcElement->eSemantic == EEST_Vertex) {
            PLYImporter::LoadVertex(loader,pcElement,&local_48,(uint)uVar2);
          }
          std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ::~vector(&local_48.alProperties);
        }
        else {
          ElementInstance::ParseInstanceBinary
                    (streamBuffer,buffer,pCur,bufferSize,pcElement,
                     (ElementInstance *)
                     ((long)&(((p_pcOut->alInstances).
                               super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                               ._M_impl.super__Vector_impl_data._M_start)->alProperties).
                             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                     + lVar1),p_bBE);
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x18;
      } while (uVar2 < pcElement->NumOccur);
    }
    return true;
  }
  __assert_fail("__null != pcElement",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                ,0x2e1,
                "static bool Assimp::PLY::ElementInstanceList::ParseInstanceListBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Element *, PLY::ElementInstanceList *, PLYImporter *, bool)"
               );
}

Assistant:

bool PLY::ElementInstanceList::ParseInstanceListBinary(
  IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Element* pcElement,
  PLY::ElementInstanceList* p_pcOut,
  PLYImporter* loader,
  bool p_bBE /* = false */)
{
  ai_assert(NULL != pcElement);

  // we can add special handling code for unknown element semantics since
  // we can't skip it as a whole block (we don't know its exact size
  // due to the fact that lists could be contained in the property list
  // of the unknown element)
  for (unsigned int i = 0; i < pcElement->NumOccur; ++i)
  {
    if (p_pcOut)
      PLY::ElementInstance::ParseInstanceBinary(streamBuffer, buffer, pCur, bufferSize, pcElement, &p_pcOut->alInstances[i], p_bBE);
    else
    {
      ElementInstance elt;
      PLY::ElementInstance::ParseInstanceBinary(streamBuffer, buffer, pCur, bufferSize, pcElement, &elt, p_bBE);

      // Create vertex or face
      if (pcElement->eSemantic == EEST_Vertex)
      {
        //call loader instance from here
        loader->LoadVertex(pcElement, &elt, i);
      }
      else if (pcElement->eSemantic == EEST_Face)
      {
        //call loader instance from here
        loader->LoadFace(pcElement, &elt, i);
      }
      else if (pcElement->eSemantic == EEST_TriStrip)
      {
        //call loader instance from here
        loader->LoadFace(pcElement, &elt, i);
      }
    }
  }
  return true;
}